

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
delete_root_subtree(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this
                   )

{
  __int_type _Var1;
  uint uVar2;
  qsbr *pqVar3;
  
  pqVar3 = qsbr::instance();
  _Var1 = (pqVar3->state).super___atomic_base<unsigned_long>._M_i;
  uVar2 = (uint)(_Var1 >> 0x20) & 0x3fffffff;
  if (uVar2 < ((uint)_Var1 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if (uVar2 < 2) {
    if ((this->root).value._M_i.tagged_ptr != 0) {
      detail::
      basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
      ::delete_subtree((basic_node_ptr<unodb::detail::olc_node_header>)
                       (this->root).value._M_i.tagged_ptr,this);
    }
    if ((this->node_counts)._M_elems[0].super___atomic_base<unsigned_long>._M_i == 0) {
      return;
    }
    __assert_fail("node_counts[as_i<node_type::LEAF>].load(std::memory_order_relaxed) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x66a,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::delete_root_subtree() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x662,
                "void unodb::olc_db<unsigned long, std::span<const std::byte>>::delete_root_subtree() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_db<Key, Value>::delete_root_subtree() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  if (root != nullptr) art_policy::delete_subtree(root, *this);

#ifdef UNODB_DETAIL_WITH_STATS
  // It is possible to reset the counter to zero instead of decrementing it for
  // each leaf, but not sure the savings will be significant.
  UNODB_DETAIL_ASSERT(
      node_counts[as_i<node_type::LEAF>].load(std::memory_order_relaxed) == 0);
#endif  // UNODB_DETAIL_WITH_STATS
}